

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

void __thiscall
Generator_isolatedFirstOrderModel_Test::TestBody(Generator_isolatedFirstOrderModel_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  char *pcVar7;
  element_type *peVar8;
  unsigned_long *in_R9;
  AssertHelper local_948 [8];
  Message local_940 [8];
  unsigned_long local_938;
  char local_930 [8];
  undefined1 local_928 [8];
  AssertionResult gtest_ar_1;
  AnalyserPtr analyser;
  Message local_900 [8];
  unsigned_long local_8f8;
  char local_8f0 [8];
  undefined1 local_8e8 [8];
  AssertionResult gtest_ar;
  ValidatorPtr validator;
  string local_8c0 [39];
  allocator<char> local_899;
  string local_898 [39];
  allocator<char> local_871;
  string local_870 [39];
  allocator<char> local_849;
  string local_848 [39];
  allocator<char> local_821;
  string local_820 [39];
  allocator<char> local_7f9;
  string local_7f8 [39];
  allocator<char> local_7d1;
  string local_7d0 [32];
  undefined1 local_7b0 [8];
  UnitsPtr mS_per_cm2;
  string local_798 [39];
  allocator<char> local_771;
  string local_770 [39];
  allocator<char> local_749;
  string local_748 [39];
  allocator<char> local_721;
  string local_720 [39];
  allocator<char> local_6f9;
  string local_6f8 [39];
  allocator<char> local_6d1;
  string local_6d0 [39];
  allocator<char> local_6a9;
  string local_6a8 [32];
  undefined1 local_688 [8];
  UnitsPtr microA_per_cm2;
  string local_670 [39];
  allocator<char> local_649;
  string local_648 [39];
  allocator<char> local_621;
  string local_620 [32];
  undefined1 local_600 [8];
  UnitsPtr per_ms;
  string local_5e8 [39];
  allocator<char> local_5c1;
  string local_5c0 [39];
  allocator<char> local_599;
  string local_598 [39];
  allocator<char> local_571;
  string local_570 [32];
  undefined1 local_550 [8];
  UnitsPtr mV;
  string local_538 [39];
  allocator<char> local_511;
  string local_510 [39];
  allocator<char> local_4e9;
  string local_4e8 [39];
  allocator<char> local_4c1;
  string local_4c0 [32];
  undefined1 local_4a0 [8];
  UnitsPtr ms;
  string local_488 [39];
  allocator<char> local_461;
  string local_460 [32];
  undefined1 local_440 [8];
  VariablePtr gamma;
  string local_428 [39];
  allocator<char> local_401;
  string local_400 [32];
  undefined1 local_3e0 [8];
  VariablePtr g_y;
  string local_3c8 [39];
  allocator<char> local_3a1;
  string local_3a0 [32];
  undefined1 local_380 [8];
  VariablePtr i_y;
  string local_368 [39];
  allocator<char> local_341;
  string local_340 [32];
  undefined1 local_320 [8];
  VariablePtr E_y;
  string local_308 [39];
  allocator<char> local_2e1;
  string local_2e0 [32];
  undefined1 local_2c0 [8];
  VariablePtr y;
  string local_2a8 [39];
  allocator<char> local_281;
  string local_280 [32];
  undefined1 local_260 [8];
  VariablePtr beta_y;
  string local_248 [39];
  allocator<char> local_221;
  string local_220 [32];
  undefined1 local_200 [8];
  VariablePtr alpha_y;
  string local_1e8 [39];
  allocator<char> local_1c1;
  string local_1c0 [32];
  undefined1 local_1a0 [8];
  VariablePtr V;
  string local_188 [39];
  allocator<char> local_161;
  string local_160 [32];
  undefined1 local_140 [8];
  VariablePtr t;
  string local_128 [8];
  string mathFooter;
  string local_100 [8];
  string equation2;
  string local_d8 [8];
  string equation1;
  string local_b0 [8];
  string mathHeader;
  string local_88 [32];
  undefined1 local_68 [8];
  ComponentPtr component;
  allocator<char> local_41;
  string local_40 [32];
  undefined1 local_20 [8];
  ModelPtr model;
  Generator_isolatedFirstOrderModel_Test *this_local;
  
  model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  libcellml::Model::create();
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"Tutorial4_FirstOrderModel",&local_41)
  ;
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  libcellml::Component::create();
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_88,"IonChannel",(allocator<char> *)(mathHeader.field_2._M_local_buf + 0xf));
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)(mathHeader.field_2._M_local_buf + 0xf));
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b0,
             "<math xmlns=\"http://www.w3.org/1998/Math/MathML\" xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\">"
             ,(allocator<char> *)(equation1.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(equation1.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d8,
             "<apply>\n  <eq/>\n  <apply>\n    <diff/>\n    <bvar>\n      <ci>t</ci>\n    </bvar>\n    <ci>y</ci>\n  </apply>\n  <apply>\n    <minus/>\n    <apply>\n      <times/>\n      <ci>alpha_y</ci>\n      <apply>\n        <minus/>\n        <cn cellml:units=\"dimensionless\">1</cn>\n        <ci>y</ci>\n      </apply>\n    </apply>\n    <apply>\n      <times/>\n      <ci>beta_y</ci>\n      <ci>y</ci>\n    </apply>\n  </apply>\n</apply>\n"
             ,(allocator<char> *)(equation2.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(equation2.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_100,
             "<apply>\n  <eq/>\n  <ci>i_y</ci>\n  <apply>\n    <times/>\n    <ci>g_y</ci>\n    <apply>\n      <minus/>\n      <ci>V</ci>\n      <ci>E_y</ci>\n    </apply>\n    <apply>\n      <power/>\n      <ci>y</ci>\n      <ci>gamma</ci>\n    </apply>\n  </apply>\n</apply>"
             ,(allocator<char> *)(mathFooter.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(mathFooter.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_128,"</math>",
             (allocator<char> *)
             ((long)&t.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&t.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_68);
  libcellml::Component::setMath((string *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_68);
  libcellml::Component::appendMath((string *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_68);
  libcellml::Component::appendMath((string *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_68);
  libcellml::Component::appendMath((string *)peVar3);
  libcellml::Variable::create();
  peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_140);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_160,"t",&local_161);
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator(&local_161);
  peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_140);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_188,"millisecond",
             (allocator<char> *)
             ((long)&V.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Variable::setUnits((string *)peVar4);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&V.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Variable::create();
  peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_1a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1c0,"V",&local_1c1);
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_1a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e8,"millivolt",
             (allocator<char> *)
             ((long)&alpha_y.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Variable::setUnits((string *)peVar4);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&alpha_y.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_1a0);
  libcellml::Variable::setInitialValue(0.0);
  libcellml::Variable::create();
  peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_200);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_220,"alpha_y",&local_221);
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator(&local_221);
  peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_200);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_248,"per_millisecond",
             (allocator<char> *)
             ((long)&beta_y.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Variable::setUnits((string *)peVar4);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&beta_y.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_200);
  libcellml::Variable::setInitialValue(1.0);
  libcellml::Variable::create();
  peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_260);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_280,"beta_y",&local_281);
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator(&local_281);
  peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_260);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2a8,"per_millisecond",
             (allocator<char> *)
             ((long)&y.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Variable::setUnits((string *)peVar4);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&y.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_260);
  libcellml::Variable::setInitialValue(2.0);
  libcellml::Variable::create();
  peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_2c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2e0,"y",&local_2e1);
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string(local_2e0);
  std::allocator<char>::~allocator(&local_2e1);
  peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_2c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_308,"dimensionless",
             (allocator<char> *)
             ((long)&E_y.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Variable::setUnits((string *)peVar4);
  std::__cxx11::string::~string(local_308);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&E_y.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_2c0);
  libcellml::Variable::setInitialValue(1.0);
  libcellml::Variable::create();
  peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_320);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_340,"E_y",&local_341);
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator(&local_341);
  peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_320);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_368,"millivolt",
             (allocator<char> *)
             ((long)&i_y.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Variable::setUnits((string *)peVar4);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&i_y.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_320);
  libcellml::Variable::setInitialValue(-85.0);
  libcellml::Variable::create();
  peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_380);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3a0,"i_y",&local_3a1);
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string(local_3a0);
  std::allocator<char>::~allocator(&local_3a1);
  peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_380);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3c8,"microA_per_cm2",
             (allocator<char> *)
             ((long)&g_y.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Variable::setUnits((string *)peVar4);
  std::__cxx11::string::~string(local_3c8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&g_y.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Variable::create();
  peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_3e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_400,"g_y",&local_401);
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string(local_400);
  std::allocator<char>::~allocator(&local_401);
  peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_3e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_428,"milliS_per_cm2",
             (allocator<char> *)
             ((long)&gamma.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Variable::setUnits((string *)peVar4);
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gamma.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_3e0);
  libcellml::Variable::setInitialValue(36.0);
  libcellml::Variable::create();
  peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_440);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_460,"gamma",&local_461);
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string(local_460);
  std::allocator<char>::~allocator(&local_461);
  peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_440);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_488,"dimensionless",
             (allocator<char> *)
             ((long)&ms.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  libcellml::Variable::setUnits((string *)peVar4);
  std::__cxx11::string::~string(local_488);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&ms.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_440);
  libcellml::Variable::setInitialValue(4.0);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_68);
  libcellml::Component::addVariable((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_68);
  libcellml::Component::addVariable((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_68);
  libcellml::Component::addVariable((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_68);
  libcellml::Component::addVariable((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_68);
  libcellml::Component::addVariable((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_68);
  libcellml::Component::addVariable((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_68);
  libcellml::Component::addVariable((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_68);
  libcellml::Component::addVariable((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_68);
  libcellml::Component::addVariable((shared_ptr *)peVar3);
  libcellml::Units::create();
  peVar5 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_4a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4c0,"millisecond",&local_4c1);
  libcellml::NamedEntity::setName((string *)peVar5);
  std::__cxx11::string::~string(local_4c0);
  std::allocator<char>::~allocator(&local_4c1);
  peVar5 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_4a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4e8,"second",&local_4e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_510,"milli",&local_511);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_538,"",
             (allocator<char> *)
             ((long)&mV.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  libcellml::Units::addUnit((string *)peVar5,local_4e8,1.0,1.0,local_510);
  std::__cxx11::string::~string(local_538);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&mV.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  std::__cxx11::string::~string(local_510);
  std::allocator<char>::~allocator(&local_511);
  std::__cxx11::string::~string(local_4e8);
  std::allocator<char>::~allocator(&local_4e9);
  libcellml::Units::create();
  peVar5 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_550);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_570,"millivolt",&local_571);
  libcellml::NamedEntity::setName((string *)peVar5);
  std::__cxx11::string::~string(local_570);
  std::allocator<char>::~allocator(&local_571);
  peVar5 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_550);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_598,"volt",&local_599);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5c0,"milli",&local_5c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_5e8,"",
             (allocator<char> *)
             ((long)&per_ms.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Units::addUnit((string *)peVar5,local_598,1.0,1.0,local_5c0);
  std::__cxx11::string::~string(local_5e8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&per_ms.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::__cxx11::string::~string(local_5c0);
  std::allocator<char>::~allocator(&local_5c1);
  std::__cxx11::string::~string(local_598);
  std::allocator<char>::~allocator(&local_599);
  libcellml::Units::create();
  peVar5 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_600);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_620,"per_millisecond",&local_621);
  libcellml::NamedEntity::setName((string *)peVar5);
  std::__cxx11::string::~string(local_620);
  std::allocator<char>::~allocator(&local_621);
  peVar5 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_600);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_648,"millisecond",&local_649);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_670,"",
             (allocator<char> *)
             ((long)&microA_per_cm2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  libcellml::Units::addUnit((string *)peVar5,-1.0,local_648);
  std::__cxx11::string::~string(local_670);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&microA_per_cm2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  std::__cxx11::string::~string(local_648);
  std::allocator<char>::~allocator(&local_649);
  libcellml::Units::create();
  peVar5 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_688);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_6a8,"microA_per_cm2",&local_6a9);
  libcellml::NamedEntity::setName((string *)peVar5);
  std::__cxx11::string::~string(local_6a8);
  std::allocator<char>::~allocator(&local_6a9);
  peVar5 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_688);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_6d0,"ampere",&local_6d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_6f8,"micro",&local_6f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_720,"",&local_721);
  libcellml::Units::addUnit((string *)peVar5,local_6d0,1.0,1.0,local_6f8);
  std::__cxx11::string::~string(local_720);
  std::allocator<char>::~allocator(&local_721);
  std::__cxx11::string::~string(local_6f8);
  std::allocator<char>::~allocator(&local_6f9);
  std::__cxx11::string::~string(local_6d0);
  std::allocator<char>::~allocator(&local_6d1);
  peVar5 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_688);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_748,"metre",&local_749);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_770,"centi",&local_771);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_798,"",
             (allocator<char> *)
             ((long)&mS_per_cm2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Units::addUnit((string *)peVar5,local_748,-2.0,1.0,local_770);
  std::__cxx11::string::~string(local_798);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&mS_per_cm2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::__cxx11::string::~string(local_770);
  std::allocator<char>::~allocator(&local_771);
  std::__cxx11::string::~string(local_748);
  std::allocator<char>::~allocator(&local_749);
  libcellml::Units::create();
  peVar5 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_7b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7d0,"milliS_per_cm2",&local_7d1);
  libcellml::NamedEntity::setName((string *)peVar5);
  std::__cxx11::string::~string(local_7d0);
  std::allocator<char>::~allocator(&local_7d1);
  peVar5 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_7b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7f8,"siemens",&local_7f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_820,"milli",&local_821);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_848,"",&local_849);
  libcellml::Units::addUnit((string *)peVar5,local_7f8,1.0,1.0,local_820);
  std::__cxx11::string::~string(local_848);
  std::allocator<char>::~allocator(&local_849);
  std::__cxx11::string::~string(local_820);
  std::allocator<char>::~allocator(&local_821);
  std::__cxx11::string::~string(local_7f8);
  std::allocator<char>::~allocator(&local_7f9);
  peVar5 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_7b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_870,"metre",&local_871);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_898,"centi",&local_899);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_8c0,"",
             (allocator<char> *)
             ((long)&validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Units::addUnit((string *)peVar5,local_870,-2.0,1.0,local_898);
  std::__cxx11::string::~string(local_8c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::__cxx11::string::~string(local_898);
  std::allocator<char>::~allocator(&local_899);
  std::__cxx11::string::~string(local_870);
  std::allocator<char>::~allocator(&local_871);
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  libcellml::Model::addUnits((shared_ptr *)peVar2);
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  libcellml::Model::addUnits((shared_ptr *)peVar2);
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  libcellml::Model::addUnits((shared_ptr *)peVar2);
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  libcellml::Model::addUnits((shared_ptr *)peVar2);
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  libcellml::Model::addUnits((shared_ptr *)peVar2);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_20);
  libcellml::Model::linkUnits();
  libcellml::Validator::create();
  peVar6 = std::__shared_ptr_access<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  libcellml::Validator::validateModel((shared_ptr *)peVar6);
  local_8f0[0] = '\0';
  local_8f0[1] = '\0';
  local_8f0[2] = '\0';
  local_8f0[3] = '\0';
  local_8f0[4] = '\0';
  local_8f0[5] = '\0';
  local_8f0[6] = '\0';
  local_8f0[7] = '\0';
  std::__shared_ptr_access<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  local_8f8 = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((AssertionResult *)local_8e8,(EqHelper<false> *)"size_t(0)","validator->issueCount()",
             local_8f0,&local_8f8,in_R9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8e8);
  if (!bVar1) {
    testing::Message::Message(local_900);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_8e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/isolated/generator.cpp"
               ,0xc9,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,local_900);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    testing::Message::~Message(local_900);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8e8);
  libcellml::Analyser::create();
  peVar8 = std::__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar_1.message_);
  libcellml::Analyser::analyseModel((shared_ptr *)peVar8);
  local_930[0] = '\0';
  local_930[1] = '\0';
  local_930[2] = '\0';
  local_930[3] = '\0';
  local_930[4] = '\0';
  local_930[5] = '\0';
  local_930[6] = '\0';
  local_930[7] = '\0';
  std::__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar_1.message_);
  local_938 = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((AssertionResult *)local_928,(EqHelper<false> *)"size_t(0)","analyser->issueCount()",
             local_930,&local_938,in_R9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_928);
  if (!bVar1) {
    testing::Message::Message(local_940);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_928);
    testing::internal::AssertHelper::AssertHelper
              (local_948,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/isolated/generator.cpp"
               ,0xd1,pcVar7);
    testing::internal::AssertHelper::operator=(local_948,local_940);
    testing::internal::AssertHelper::~AssertHelper(local_948);
    testing::Message::~Message(local_940);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_928);
  std::shared_ptr<libcellml::Analyser>::~shared_ptr
            ((shared_ptr<libcellml::Analyser> *)&gtest_ar_1.message_);
  std::shared_ptr<libcellml::Validator>::~shared_ptr
            ((shared_ptr<libcellml::Validator> *)&gtest_ar.message_);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_7b0);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_688);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_600);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_550);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_4a0);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_440);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_3e0);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_380);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_320);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_2c0);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_260);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_200);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_1a0);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_140);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_b0);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_68);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_20);
  return;
}

Assistant:

TEST(Generator, isolatedFirstOrderModel)
{
    // This test resulted from https://github.com/cellml/libcellml/issues/432

    //  1.a   Create the model instance.
    libcellml::ModelPtr model = libcellml::Model::create();
    model->setName("Tutorial4_FirstOrderModel");

    //  1.b   Create a component and add it into the model.
    libcellml::ComponentPtr component = libcellml::Component::create();
    component->setName("IonChannel");
    model->addComponent(component);

    //  2.a   Define the mathematics.
    const std::string mathHeader = "<math xmlns=\"http://www.w3.org/1998/Math/MathML\" xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\">";

    // dy/dt = alpha_y*(1-y) - beta_y*y
    const std::string equation1 =
        "<apply>\n"
        "  <eq/>\n"
        "  <apply>\n"
        "    <diff/>\n"
        "    <bvar>\n"
        "      <ci>t</ci>\n"
        "    </bvar>\n"
        "    <ci>y</ci>\n"
        "  </apply>\n"
        "  <apply>\n"
        "    <minus/>\n"
        "    <apply>\n"
        "      <times/>\n"
        "      <ci>alpha_y</ci>\n"
        "      <apply>\n"
        "        <minus/>\n"
        "        <cn cellml:units=\"dimensionless\">1</cn>\n"
        "        <ci>y</ci>\n"
        "      </apply>\n"
        "    </apply>\n"
        "    <apply>\n"
        "      <times/>\n"
        "      <ci>beta_y</ci>\n"
        "      <ci>y</ci>\n"
        "    </apply>\n"
        "  </apply>\n"
        "</apply>\n";
    // i_y = g_y*power(y,gamma)*(V-E_y)
    const std::string equation2 =
        "<apply>\n"
        "  <eq/>\n"
        "  <ci>i_y</ci>\n"
        "  <apply>\n"
        "    <times/>\n"
        "    <ci>g_y</ci>\n"
        "    <apply>\n"
        "      <minus/>\n"
        "      <ci>V</ci>\n"
        "      <ci>E_y</ci>\n"
        "    </apply>\n"
        "    <apply>\n"
        "      <power/>\n"
        "      <ci>y</ci>\n"
        "      <ci>gamma</ci>\n"
        "    </apply>\n"
        "  </apply>\n"
        "</apply>";
    const std::string mathFooter = "</math>";

    //  2.b   Add the maths to the component. Note that there is only one maths
    //        string stored, so parts which are appended must create a viable
    //        MathML string when concatenated. To clear any string, which is
    //        already stored, simply call setMath("") with an empty string.
    component->setMath(mathHeader);
    component->appendMath(equation1);
    component->appendMath(equation2);
    component->appendMath(mathFooter);

    //  3.a,b Declaring the variables, their names, units, and initial conditions
    //        Note that the names given to variables must be the same as that used
    //        within the <ci> blocks in the MathML string we created in step 2.a.

    libcellml::VariablePtr t = libcellml::Variable::create();
    t->setName("t");
    t->setUnits("millisecond");
    // Note: time is our integration base variable so it is not initialised.

    libcellml::VariablePtr V = libcellml::Variable::create();
    V->setName("V");
    V->setUnits("millivolt");
    V->setInitialValue(0.0);

    libcellml::VariablePtr alpha_y = libcellml::Variable::create();
    alpha_y->setName("alpha_y");
    alpha_y->setUnits("per_millisecond");
    alpha_y->setInitialValue(1.0);

    libcellml::VariablePtr beta_y = libcellml::Variable::create();
    beta_y->setName("beta_y");
    beta_y->setUnits("per_millisecond");
    beta_y->setInitialValue(2.0);

    libcellml::VariablePtr y = libcellml::Variable::create();
    y->setName("y");
    y->setUnits("dimensionless");
    y->setInitialValue(1.0);

    libcellml::VariablePtr E_y = libcellml::Variable::create();
    E_y->setName("E_y");
    E_y->setUnits("millivolt");
    E_y->setInitialValue(-85.0);

    libcellml::VariablePtr i_y = libcellml::Variable::create();
    i_y->setName("i_y");
    i_y->setUnits("microA_per_cm2");
    // Note that no initial value is needed for this variable as its value
    // is defined by equation2.

    libcellml::VariablePtr g_y = libcellml::Variable::create();
    g_y->setName("g_y");
    g_y->setUnits("milliS_per_cm2");
    g_y->setInitialValue(36.0);

    libcellml::VariablePtr gamma = libcellml::Variable::create();
    gamma->setName("gamma");
    gamma->setUnits("dimensionless");
    gamma->setInitialValue(4.0);

    //  3.c   Adding the variables to the component. Note that Variables are
    //        added by their pointer (cf. their name).
    component->addVariable(t);
    component->addVariable(V);
    component->addVariable(E_y);
    component->addVariable(gamma);
    component->addVariable(i_y);
    component->addVariable(g_y);
    component->addVariable(alpha_y);
    component->addVariable(beta_y);
    component->addVariable(y);

    //  4.a   Defining the units of millisecond, millivolt, per_millisecond,
    //        microA_per_cm2, and milliS_per_cm2. Note that the dimensionless
    //        units are part of those built-in already, so they don't need to be
    //        defined here.
    libcellml::UnitsPtr ms = libcellml::Units::create();
    ms->setName("millisecond");
    ms->addUnit("second", "milli");

    libcellml::UnitsPtr mV = libcellml::Units::create();
    mV->setName("millivolt");
    mV->addUnit("volt", "milli");

    libcellml::UnitsPtr per_ms = libcellml::Units::create();
    per_ms->setName("per_millisecond");
    per_ms->addUnit("millisecond", -1.0);

    libcellml::UnitsPtr microA_per_cm2 = libcellml::Units::create();
    microA_per_cm2->setName("microA_per_cm2");
    microA_per_cm2->addUnit("ampere", "micro");
    microA_per_cm2->addUnit("metre", "centi", -2.0);

    libcellml::UnitsPtr mS_per_cm2 = libcellml::Units::create();
    mS_per_cm2->setName("milliS_per_cm2");
    mS_per_cm2->addUnit("siemens", "milli");
    mS_per_cm2->addUnit("metre", "centi", -2.0);

    //  4.b   Add these units into the model.
    model->addUnits(ms);
    model->addUnits(mV);
    model->addUnits(per_ms);
    model->addUnits(microA_per_cm2);
    model->addUnits(mS_per_cm2);

    // Link the units used by variables in the model to
    // units added to the model.
    model->linkUnits();

    //  4.c   Validate the final arrangement. No issues are expected at this stage.
    libcellml::ValidatorPtr validator = libcellml::Validator::create();
    validator->validateModel(model);
    EXPECT_EQ(size_t(0), validator->issueCount());

    //  5.a   Create an Analyser instance and analyse the model.

    libcellml::AnalyserPtr analyser = libcellml::Analyser::create();
    analyser->analyseModel(model);

    //  5.b   Check whether the analyser has encountered any issues.
    EXPECT_EQ(size_t(0), analyser->issueCount());
}